

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O3

string * __thiscall
absl::lts_20240722::strings_internal::
JoinAlgorithm<google::protobuf::internal::RepeatedIterator<int_const>,absl::lts_20240722::strings_internal::AlphaNumFormatterImpl>
          (string *__return_storage_ptr__,strings_internal *this,RepeatedIterator<const_int> start,
          RepeatedIterator<const_int> end,string_view s,AlphaNumFormatterImpl *f)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  AlphaNum local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (strings_internal *)start.it_) {
    pcVar1 = local_60.digits_;
    pcVar3 = "";
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar3);
      lVar2 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*(int *)this,pcVar1);
      local_60.piece_._M_len = lVar2 - (long)pcVar1;
      local_60.piece_._M_str = pcVar1;
      absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,&local_60);
      this = this + 4;
      pcVar3 = (char *)s._M_len;
    } while (this != (strings_internal *)start.it_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          Formatter&& f) {
  std::string result;
  absl::string_view sep("");
  for (Iterator it = start; it != end; ++it) {
    result.append(sep.data(), sep.size());
    f(&result, *it);
    sep = s;
  }
  return result;
}